

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O2

void Curl_cshutdn_destroy(cshutdn *cshutdn,Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  size_t sVar3;
  Curl_llist_node *pCVar4;
  timediff_t tVar5;
  connectdata *conn;
  char *fmt;
  int iVar6;
  curltime cVar7;
  curltime cVar8;
  curltime newer;
  curl_pollfds local_140;
  pollfd a_few_on_stack [10];
  sigpipe_ignore local_d0;
  
  if ((data != (Curl_easy *)0x0) && ((cshutdn->field_0x28 & 1) != 0)) {
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
        (0 < Curl_trc_feat_multi.log_level)))) {
      sVar3 = Curl_llist_count(&cshutdn->list);
      Curl_trc_multi(data,"[SHUTDOWN] destroy, %zu connections, timeout=%dms",sVar3,0);
    }
    cVar7 = Curl_now();
    if (((((data->set).field_0x89f & 0x40) != 0) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_multi.log_level)) {
      Curl_trc_multi(data,"[SHUTDOWN] shutdown all");
    }
    memset(&local_d0,0,0xa0);
    local_d0._152_1_ = 1;
    sigpipe_apply(data,&local_d0);
    while( true ) {
      pCVar4 = Curl_llist_head(&cshutdn->list);
      if (pCVar4 == (Curl_llist_node *)0x0) break;
      cshutdn_perform(cshutdn,data);
      pCVar4 = Curl_llist_head(&cshutdn->list);
      if (pCVar4 == (Curl_llist_node *)0x0) {
        if (((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ))) && (0 < Curl_trc_feat_multi.log_level)) {
          fmt = "[SHUTDOWN] shutdown finished cleanly";
LAB_0011f043:
          Curl_trc_multi(data,fmt);
        }
        break;
      }
      cVar8 = Curl_now();
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar8._0_12_,0);
      newer.tv_usec = SUB124(cVar8._0_12_,8);
      cVar8._12_4_ = 0;
      cVar8.tv_sec = SUB128(cVar7._0_12_,0);
      cVar8.tv_usec = SUB124(cVar7._0_12_,8);
      tVar5 = Curl_timediff(newer,cVar8);
      if (-1 < tVar5) {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ) && (0 < Curl_trc_feat_multi.log_level)))) {
          Curl_trc_multi(data,"[SHUTDOWN] shutdown finished, %s","best effort done");
        }
        break;
      }
      Curl_pollfds_init(&local_140,a_few_on_stack,10);
      CVar2 = Curl_cshutdn_add_pollfds(cshutdn,data,&local_140);
      if (CVar2 != CURLE_OK) {
        Curl_pollfds_cleanup(&local_140);
        if (((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ))) && (0 < Curl_trc_feat_multi.log_level)) {
          fmt = "[SHUTDOWN] shutdown finished, aborted";
          goto LAB_0011f043;
        }
        break;
      }
      iVar6 = -(int)tVar5;
      if (999 < iVar6) {
        iVar6 = 1000;
      }
      Curl_poll(local_140.pfds,local_140.n,(long)iVar6);
      Curl_pollfds_cleanup(&local_140);
    }
    while( true ) {
      pCVar4 = Curl_llist_head(&cshutdn->list);
      if (pCVar4 == (Curl_llist_node *)0x0) break;
      conn = (connectdata *)Curl_node_elem(pCVar4);
      Curl_node_remove(pCVar4);
      Curl_cshutdn_terminate(data,conn,false);
    }
    sigpipe_restore(&local_d0);
  }
  cshutdn->multi = (Curl_multi *)0x0;
  return;
}

Assistant:

void Curl_cshutdn_destroy(struct cshutdn *cshutdn,
                          struct Curl_easy *data)
{
  if(cshutdn->initialised && data) {
    int timeout_ms = 0;
    /* Just for testing, run graceful shutdown */
#ifdef DEBUGBUILD
    {
      const char *p = getenv("CURL_GRACEFUL_SHUTDOWN");
      if(p) {
        curl_off_t l;
        if(!Curl_str_number(&p, &l, INT_MAX))
          timeout_ms = (int)l;
      }
    }
#endif

    CURL_TRC_M(data, "[SHUTDOWN] destroy, %zu connections, timeout=%dms",
               Curl_llist_count(&cshutdn->list), timeout_ms);
    cshutdn_terminate_all(cshutdn, data, timeout_ms);
  }
  cshutdn->multi = NULL;
}